

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

int cfd::core::ConstantNonceFunction
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,uchar *xonly_pk32,void *data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  uVar1 = *data;
  uVar2 = *(undefined8 *)((long)data + 8);
  uVar3 = *(undefined8 *)((long)data + 0x18);
  *(undefined8 *)(nonce32 + 0x10) = *(undefined8 *)((long)data + 0x10);
  *(undefined8 *)(nonce32 + 0x18) = uVar3;
  *(undefined8 *)nonce32 = uVar1;
  *(undefined8 *)(nonce32 + 8) = uVar2;
  return 1;
}

Assistant:

int ConstantNonceFunction(
    unsigned char *nonce32, const unsigned char *msg32,
    const unsigned char *key32, const unsigned char *algo16,
    const unsigned char *xonly_pk32, void *data) {
  (void)msg32;
  (void)key32;
  (void)algo16;
  (void)xonly_pk32;
  std::memcpy(nonce32, (const unsigned char *)data, 32);
  return 1;
}